

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXSocket.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
ix::Socket::readBytes_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Socket *this,size_t length,OnProgressCallback *onProgressCallback
          ,CancellationRequest *isCancellationRequested)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar2;
  int iVar3;
  PollResultType PVar4;
  pointer puVar5;
  int extraout_var;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined1 uStack_38;
  undefined4 uStack_37;
  undefined2 uStack_33;
  char cStack_31;
  
  if ((this->_readBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->_readBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_readBuffer,0x8000);
  }
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if ((long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == length) {
      local_50 = &local_40;
      ::std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)&local_50);
      __return_storage_ptr__->first = true;
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if (local_50 == &local_40) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
        *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) =
             CONCAT17(cStack_31,CONCAT25(uStack_33,CONCAT41(uStack_37,uStack_38)));
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = local_50;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity =
             CONCAT71(uStack_3f,local_40);
      }
      (__return_storage_ptr__->second)._M_string_length = local_48;
      goto LAB_0016fafe;
    }
    if (((isCancellationRequested->super__Function_base)._M_manager != (_Manager_type)0x0) &&
       (bVar2 = ::std::function<bool_()>::operator()(isCancellationRequested), bVar2)) break;
    puVar5 = output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (length - (long)output.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
    if ((pointer)0x7fff < puVar5) {
      puVar5 = (pointer)0x8000;
    }
    iVar3 = (*this->_vptr_Socket[6])
                      (this,(this->_readBuffer).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,puVar5);
    if ((CONCAT44(extraout_var,iVar3) == 0 || extraout_var < 0) && (bVar2 = isWaitNeeded(), !bVar2))
    break;
    __first._M_current =
         (this->_readBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&output,
               (const_iterator)
               output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,__first,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + CONCAT44(extraout_var,iVar3)));
    if ((onProgressCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      ::std::function<bool_(int,_int)>::operator()
                (onProgressCallback,
                 (int)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                 (int)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,(int)length);
    }
    PVar4 = isReadyToRead(this,1);
  } while (PVar4 != Error);
  __return_storage_ptr__->first = false;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 1) = CONCAT17(uStack_38,uStack_3f);
  *(undefined4 *)((long)&(__return_storage_ptr__->second).field_2 + 9) = uStack_37;
  *(undefined2 *)((long)&(__return_storage_ptr__->second).field_2 + 0xd) = uStack_33;
  (__return_storage_ptr__->second).field_2._M_local_buf[0xf] = cStack_31;
  (__return_storage_ptr__->second)._M_string_length = 0;
LAB_0016fafe:
  local_50 = &local_40;
  local_40 = '\0';
  local_48 = 0;
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> Socket::readBytes(
        size_t length,
        const OnProgressCallback& onProgressCallback,
        const CancellationRequest& isCancellationRequested)
    {
        if (_readBuffer.empty())
        {
            _readBuffer.resize(kChunkSize);
        }

        std::vector<uint8_t> output;
        while (output.size() != length)
        {
            if (isCancellationRequested && isCancellationRequested())
            {
                return std::make_pair(false, std::string());
            }

            size_t size = std::min(kChunkSize, length - output.size());
            ssize_t ret = recv((char*)&_readBuffer[0], size);

            if (ret <= 0 && !Socket::isWaitNeeded())
            {
                // Error
                return std::make_pair(false, std::string());
            }
            else
            {
                output.insert(output.end(),
                              _readBuffer.begin(),
                              _readBuffer.begin() + ret);
            }

            if (onProgressCallback) onProgressCallback((int) output.size(), (int) length);

            // Wait with a 1ms timeout until the socket is ready to read.
            // This way we are not busy looping
            if (isReadyToRead(1) == PollResultType::Error)
            {
                return std::make_pair(false, std::string());
            }
        }

        return std::make_pair(true, std::string(output.begin(),
                                                output.end()));
    }